

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LINChecksum.cpp
# Opt level: O2

U8 __thiscall LINChecksum::add(LINChecksum *this,U8 byte)

{
  ushort uVar1;
  ushort uVar2;
  undefined1 in_register_00000031;
  
  uVar1 = CONCAT11(in_register_00000031,byte) + this->mChecksum;
  uVar2 = uVar1 - 0xff;
  if (uVar1 < 0x100) {
    uVar2 = uVar1;
  }
  this->mChecksum = uVar2;
  return (U8)uVar2;
}

Assistant:

U8 LINChecksum::add( U8 byte )
{
    mChecksum += byte;
    if( mChecksum >= 256 )
        mChecksum -= 255;

    // if ( mChecksum & 0x100 ) // carry?
    //	mChecksum += 1;
    return ( U8 )( mChecksum & 0xFF );
}